

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Object * __thiscall Am_Object::operator=(Am_Object *this,Am_Value *in_value)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object_Data *pAVar3;
  ostream *poVar4;
  
  pAVar2 = (Am_Object_Data *)(in_value->value).wrapper_value;
  if (((pAVar2 != (Am_Object_Data *)0x0) && (in_value->type != 1)) &&
     (in_value->type != Am_Object_Data::id)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar4 = std::operator<<(poVar4,"** Tried to assign Am_Object ");
    ::operator<<(poVar4,this);
    poVar4 = std::operator<<(poVar4," with a non Am_Object value ");
    poVar4 = ::operator<<(poVar4,in_value);
    std::endl<char,std::char_traits<char>>(poVar4);
    Am_Error();
  }
  pAVar3 = this->data;
  this->data = pAVar2;
  if (pAVar2 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  if (pAVar3 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar3->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  return this;
}

Assistant:

Am_Object &
Am_Object::operator=(const Am_Value &in_value)
{
  if (in_value.value.wrapper_value &&
      (in_value.type != Am_Object_Data::Am_Object_Data_ID() &&
       in_value.type != Am_ZERO))
    Am_ERRORO("** Tried to assign Am_Object "
                  << *this << " with a non Am_Object value " << in_value,
              *this, Am_NO_SLOT);
  Am_Object_Data *old_data = data;
  data = (Am_Object_Data *)in_value.value.wrapper_value;
  if (data) {
    data->Note_Reference();
  }
  if (old_data)
    old_data->Release();
  return *this;
}